

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopDescriptor::PostModificationCleanup(LoopDescriptor *this)

{
  pointer __src;
  Loop **__src_00;
  pointer *pppLVar1;
  pointer ppLVar2;
  Loop *pLVar3;
  iterator iVar4;
  _Hash_node_base *p_Var5;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> _Var6;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  _Var7;
  pointer ppLVar8;
  Loop **ppLVar9;
  LoopContainerType *__range2;
  LoopsToAddContainerType *this_00;
  Loop **ppLVar10;
  Loop *loop_2;
  pointer ppLVar11;
  Loop *pLVar12;
  pointer ppVar13;
  pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>
  *pair;
  pointer __pos;
  Loop *loop_1;
  Loop *loop;
  LoopContainerType loops_to_remove_;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_80;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_78;
  undefined4 local_6c;
  Loop **local_68;
  iterator iStack_60;
  Loop **local_58;
  LoopsToAddContainerType *local_48;
  pointer local_40;
  LoopDescriptor *local_38;
  
  local_68 = (Loop **)0x0;
  iStack_60._M_current = (Loop **)0x0;
  local_58 = (Loop **)0x0;
  ppLVar11 = (this->loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar11 != ppLVar2) {
    do {
      local_78._M_head_impl = *ppLVar11;
      if ((local_78._M_head_impl)->loop_is_marked_for_removal_ == true) {
        if (iStack_60._M_current == local_58) {
          std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
          _M_realloc_insert<spvtools::opt::Loop*const&>
                    ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)&local_68,
                     iStack_60,&local_78._M_head_impl);
        }
        else {
          *iStack_60._M_current = local_78._M_head_impl;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        pLVar3 = (local_78._M_head_impl)->parent_;
        if (pLVar3 != (Loop *)0x0) {
          local_80._M_head_impl = local_78._M_head_impl;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                            ((pLVar3->nested_loops_).
                             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pLVar3->nested_loops_).
                             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_80);
          __src = _Var7._M_current + 1;
          ppLVar8 = (pLVar3->nested_loops_).
                    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != ppLVar8) {
            memmove(_Var7._M_current,__src,(long)ppLVar8 - (long)__src);
            ppLVar8 = (pLVar3->nested_loops_).
                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          (pLVar3->nested_loops_).
          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppLVar8 + -1;
          (local_80._M_head_impl)->parent_ = (Loop *)0x0;
        }
      }
      iVar4._M_current = iStack_60._M_current;
      ppLVar11 = ppLVar11 + 1;
    } while (ppLVar11 != ppLVar2);
    if (local_68 != iStack_60._M_current) {
      ppLVar10 = local_68;
      do {
        local_80._M_head_impl = *ppLVar10;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                          ((this->loops_).
                           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->loops_).
                           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_80);
        __src_00 = _Var7._M_current + 1;
        ppLVar9 = (this->loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (__src_00 != ppLVar9) {
          memmove(_Var7._M_current,__src_00,(long)ppLVar9 - (long)__src_00);
          ppLVar9 = (this->loops_).
                    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        _Var6._M_head_impl = local_80._M_head_impl;
        (this->loops_).
        super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppLVar9 + -1;
        if (local_80._M_head_impl != (Loop *)0x0) {
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&((local_80._M_head_impl)->loop_basic_blocks_)._M_h);
          ppLVar11 = ((_Var6._M_head_impl)->nested_loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppLVar11 != (pointer)0x0) {
            operator_delete(ppLVar11,(long)((_Var6._M_head_impl)->nested_loops_).
                                           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)ppLVar11);
          }
        }
        operator_delete(_Var6._M_head_impl,0x90);
        ppLVar10 = ppLVar10 + 1;
      } while (ppLVar10 != iVar4._M_current);
    }
  }
  __pos = (this->loops_to_add_).
          super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar13 = (this->loops_to_add_).
            super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->loops_to_add_;
  if (__pos != ppVar13) {
    local_48 = &this->loops_to_add_;
    local_40 = ppVar13;
    local_38 = this;
    do {
      pLVar3 = __pos->first;
      local_80._M_head_impl =
           (__pos->second)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>.
           _M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
           super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl;
      (__pos->second)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
      super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl = (Loop *)0x0;
      if (pLVar3 != (Loop *)0x0) {
        (local_80._M_head_impl)->parent_ = (Loop *)0x0;
        iVar4._M_current =
             (pLVar3->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_78._M_head_impl = local_80._M_head_impl;
        if (iVar4._M_current ==
            (pLVar3->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
          _M_realloc_insert<spvtools::opt::Loop*const&>
                    ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                     &pLVar3->nested_loops_,iVar4,&local_80._M_head_impl);
        }
        else {
          *iVar4._M_current = local_80._M_head_impl;
          pppLVar1 = &(pLVar3->nested_loops_).
                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
        (local_80._M_head_impl)->parent_ = pLVar3;
        local_80._M_head_impl = local_78._M_head_impl;
        for (p_Var5 = ((local_78._M_head_impl)->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
            p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
          local_6c = *(undefined4 *)&p_Var5[1]._M_nxt;
          pLVar12 = pLVar3;
          local_78._M_head_impl = local_80._M_head_impl;
          do {
            local_80._M_head_impl = (Loop *)&pLVar12->loop_basic_blocks_;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_80._M_head_impl,&local_6c,&local_80);
            pLVar12 = pLVar12->parent_;
          } while (pLVar12 != (Loop *)0x0);
          ppVar13 = local_40;
          local_80._M_head_impl = local_78._M_head_impl;
        }
      }
      local_78._M_head_impl = (Loop *)0x0;
      std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
      emplace_back<spvtools::opt::Loop*>
                ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)local_38,
                 &local_80._M_head_impl);
      if (local_78._M_head_impl != (Loop *)0x0) {
        std::default_delete<spvtools::opt::Loop>::operator()
                  ((default_delete<spvtools::opt::Loop> *)&local_78,local_78._M_head_impl);
      }
      __pos = __pos + 1;
    } while (__pos != ppVar13);
    __pos = (local_48->
            super__Vector_base<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    this_00 = local_48;
  }
  std::
  vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ::_M_erase_at_end(this_00,__pos);
  if (local_68 != (Loop **)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

void LoopDescriptor::PostModificationCleanup() {
  LoopContainerType loops_to_remove_;
  for (Loop* loop : loops_) {
    if (loop->IsMarkedForRemoval()) {
      loops_to_remove_.push_back(loop);
      if (loop->HasParent()) {
        loop->GetParent()->RemoveChildLoop(loop);
      }
    }
  }

  for (Loop* loop : loops_to_remove_) {
    loops_.erase(std::find(loops_.begin(), loops_.end(), loop));
    delete loop;
  }

  for (auto& pair : loops_to_add_) {
    Loop* parent = pair.first;
    std::unique_ptr<Loop> loop = std::move(pair.second);

    if (parent) {
      loop->SetParent(nullptr);
      parent->AddNestedLoop(loop.get());

      for (uint32_t block_id : loop->GetBlocks()) {
        parent->AddBasicBlock(block_id);
      }
    }

    loops_.emplace_back(loop.release());
  }

  loops_to_add_.clear();
}